

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRVariable * __thiscall
spirv_cross::CompilerGLSL::find_color_output_by_location(CompilerGLSL *this,uint32_t location)

{
  anon_class_24_3_9e364491 local_38;
  SPIRVariable *local_20;
  SPIRVariable *ret;
  CompilerGLSL *pCStack_10;
  uint32_t location_local;
  CompilerGLSL *this_local;
  
  local_20 = (SPIRVariable *)0x0;
  local_38.location = (uint32_t *)((long)&ret + 4);
  local_38.ret = &local_20;
  local_38.this = this;
  ret._4_4_ = location;
  pCStack_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::find_color_output_by_location(unsigned_int)const::__0>
            (&(this->super_Compiler).ir,&local_38);
  return local_20;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_color_output_by_location(uint32_t location) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage == StorageClassOutput && get_decoration(var.self, DecorationLocation) == location)
			ret = &var;
	});
	return ret;
}